

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qipaddress.cpp
# Opt level: O0

QChar * QIPAddressUtils::checkedToAscii(Buffer *buffer,QChar *begin,QChar *end)

{
  char *pcVar1;
  QChar *in_RDX;
  QChar *in_RSI;
  QVLABase<char> *in_RDI;
  char *dst;
  char16_t *src;
  char16_t *uend;
  char16_t *ubegin;
  qsizetype in_stack_ffffffffffffffb8;
  QVarLengthArray<char,_64LL> *in_stack_ffffffffffffffc0;
  QChar *local_38;
  
  QVarLengthArray<char,_64LL>::resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pcVar1 = QVLABase<char>::data(in_RDI);
  local_38 = in_RSI;
  while( true ) {
    if (local_38 == in_RDX) {
      *pcVar1 = '\0';
      return (QChar *)0x0;
    }
    if (0x7e < (ushort)local_38->ucs) break;
    *pcVar1 = (char)local_38->ucs;
    pcVar1 = pcVar1 + 1;
    local_38 = local_38 + 1;
  }
  return local_38;
}

Assistant:

static const QChar *checkedToAscii(Buffer &buffer, const QChar *begin, const QChar *end)
{
    const auto *const ubegin = reinterpret_cast<const char16_t *>(begin);
    const auto *const uend = reinterpret_cast<const char16_t *>(end);
    auto *src = ubegin;

    buffer.resize(uend - ubegin + 1);
    char *dst = buffer.data();

    while (src != uend) {
        if (*src >= 0x7f)
            return reinterpret_cast<const QChar *>(src);
        *dst++ = *src++;
    }
    *dst = '\0';
    return nullptr;
}